

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_has_extension_nocontext.c
# Opt level: O0

int main(void)

{
  ulong uVar1;
  _Bool pass;
  
  dpy = get_display_or_skip();
  uVar1 = epoxy_has_glx_extension(dpy,0,"GLX_ARB_get_proc_address");
  if ((uVar1 & 1) == 0) {
    errx(1,"Implementation reported absence of GLX_ARB_get_proc_address");
  }
  uVar1 = epoxy_has_glx_extension(dpy,0,"GLX_ARB_ham_sandwich");
  if ((uVar1 & 1) != 0) {
    errx(1,"Implementation reported presence of GLX_ARB_ham_sandwich");
  }
  return 0;
}

Assistant:

int main(void)
{
    bool pass = true;

    dpy = get_display_or_skip();

    if (!epoxy_has_glx_extension(dpy, 0, "GLX_ARB_get_proc_address"))
        errx(1, "Implementation reported absence of GLX_ARB_get_proc_address");

    if (epoxy_has_glx_extension(dpy, 0, "GLX_ARB_ham_sandwich"))
        errx(1, "Implementation reported presence of GLX_ARB_ham_sandwich");

    return pass != true;
}